

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ParserAlloc(_func_void_ptr_size_t *mallocProc)

{
  undefined4 *puVar1;
  yyParser *pParser;
  _func_void_ptr_size_t *mallocProc_local;
  
  puVar1 = (undefined4 *)(*mallocProc)(0xc90);
  if (puVar1 != (undefined4 *)0x0) {
    *puVar1 = 0xffffffff;
  }
  return puVar1;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ParserAlloc(void *(*mallocProc)(size_t)){
  yyParser *pParser;
  pParser = (yyParser*)(*mallocProc)( (size_t)sizeof(yyParser) );
  if( pParser ){
    pParser->yyidx = -1;
#ifdef YYTRACKMAXSTACKDEPTH
    pParser->yyidxMax = 0;
#endif
#if YYSTACKDEPTH<=0
    pParser->yystack = NULL;
    pParser->yystksz = 0;
    yyGrowStack(pParser);
#endif
  }
  return pParser;
}